

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O2

void __thiscall QColorDialogPrivate::retranslateStrings(QColorDialogPrivate *this)

{
  QLabel *pQVar1;
  QPushButton *pQVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->super_QDialogPrivate).nativeDialogInUse == false) {
    if (this->smallDisplay == false) {
      pQVar1 = this->lblBasicColors;
      QColorDialog::tr((QString *)&local_40,"&Basic colors",(char *)0x0,-1);
      QLabel::setText(pQVar1,(QString *)&local_40);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
      pQVar1 = this->lblCustomColors;
      QColorDialog::tr((QString *)&local_40,"&Custom colors",(char *)0x0,-1);
      QLabel::setText(pQVar1,(QString *)&local_40);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
      pQVar2 = this->addCusBt;
      QColorDialog::tr((QString *)&local_40,"&Add to Custom Colors",(char *)0x0,-1);
      QAbstractButton::setText(&pQVar2->super_QAbstractButton,(QString *)&local_40);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
      pQVar2 = this->eyeDropperButton;
      if (pQVar2 != (QPushButton *)0x0) {
        QColorDialog::tr((QString *)&local_40,"&Pick Screen Color",(char *)0x0,-1);
        QAbstractButton::setText(&pQVar2->super_QAbstractButton,(QString *)&local_40);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
      }
    }
    QtPrivate::QColorShower::retranslateStrings(this->cs);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorDialogPrivate::retranslateStrings()
{
    if (nativeDialogInUse)
        return;

    if (!smallDisplay) {
        lblBasicColors->setText(QColorDialog::tr("&Basic colors"));
        lblCustomColors->setText(QColorDialog::tr("&Custom colors"));
        addCusBt->setText(QColorDialog::tr("&Add to Custom Colors"));
#if !defined(QT_SMALL_COLORDIALOG)
        if (eyeDropperButton)
            eyeDropperButton->setText(QColorDialog::tr("&Pick Screen Color"));
#endif
    }

    cs->retranslateStrings();
}